

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int memjrnlWrite(sqlite3_file *pJfd,void *zBuf,int iAmt,sqlite_int64 iOfst)

{
  int iVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  long lVar4;
  sqlite3_io_methods *psVar5;
  sqlite3_io_methods *psVar6;
  sqlite3_io_methods *psVar7;
  sqlite3_io_methods *psVar8;
  sqlite3_io_methods *psVar9;
  sqlite3_io_methods *psVar10;
  sqlite3_io_methods *psVar11;
  sqlite3_io_methods *psVar12;
  sqlite3_io_methods *psVar13;
  bool bVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  sqlite3_file sVar18;
  sqlite3_io_methods *psVar19;
  long lVar20;
  sqlite3_file sVar21;
  size_t __n;
  long in_FS_OFFSET;
  
  lVar4 = *(long *)(in_FS_OFFSET + 0x28);
  iVar17 = *(int *)((long)&pJfd[1].pMethods + 4);
  if (((long)iVar17 < 1) || (iAmt + iOfst <= (long)iVar17)) {
    if ((0 < iOfst) && (pJfd[3].pMethods != (sqlite3_io_methods *)iOfst)) {
      memjrnlTruncate(pJfd,iOfst);
    }
    if ((iOfst == 0) && (pJfd[2].pMethods != (sqlite3_io_methods *)0x0)) {
      memcpy(&(pJfd[2].pMethods)->xClose,zBuf,(long)iAmt);
LAB_0012bf7b:
      iVar15 = 0;
    }
    else {
      do {
        if (iAmt < 1) goto LAB_0012bf7b;
        sVar21.pMethods = pJfd[4].pMethods;
        iVar17 = *(int *)&pJfd[1].pMethods;
        lVar20 = (long)pJfd[3].pMethods % (long)iVar17;
        iVar15 = iVar17 - (int)lVar20;
        if (iAmt < iVar15) {
          iVar15 = iAmt;
        }
        if (lVar20 == 0) {
          sVar18.pMethods = (sqlite3_io_methods *)sqlite3_malloc(iVar17 + 8);
          if (sVar18.pMethods != (sqlite3_io_methods *)0x0) {
            if (sVar21.pMethods == (sqlite3_io_methods *)0x0) {
              sVar21.pMethods = (sqlite3_io_methods *)(pJfd + 2);
            }
            *(undefined8 *)sVar18.pMethods = 0;
            *(sqlite3_io_methods **)sVar21.pMethods = sVar18.pMethods;
            pJfd[4].pMethods = sVar18.pMethods;
            sVar21.pMethods = sVar18.pMethods;
          }
          if (sVar18.pMethods != (sqlite3_io_methods *)0x0) goto LAB_0012bf24;
          bVar14 = false;
        }
        else {
LAB_0012bf24:
          __n = (size_t)iVar15;
          memcpy((void *)((long)&(sVar21.pMethods)->xClose + lVar20),zBuf,__n);
          zBuf = (void *)((long)zBuf + __n);
          iAmt = iAmt - iVar15;
          pJfd[3].pMethods = (sqlite3_io_methods *)((long)&(pJfd[3].pMethods)->iVersion + __n);
          bVar14 = true;
        }
      } while (bVar14);
      iVar15 = 0xc0a;
    }
LAB_0012c043:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar4) {
      return iVar15;
    }
  }
  else {
    psVar5 = pJfd->pMethods;
    iVar1 = *(int *)&pJfd[1].pMethods;
    psVar6 = pJfd[2].pMethods;
    psVar7 = pJfd[3].pMethods;
    psVar8 = pJfd[6].pMethods;
    psVar12 = pJfd[4].pMethods;
    psVar13 = pJfd[5].pMethods;
    uVar2 = *(undefined4 *)&pJfd[7].pMethods;
    uVar3 = *(undefined4 *)((long)&pJfd[7].pMethods + 4);
    psVar9 = pJfd[8].pMethods;
    psVar10 = pJfd[9].pMethods;
    pJfd->pMethods = (sqlite3_io_methods *)0x0;
    pJfd[1].pMethods = (sqlite3_io_methods *)0x0;
    pJfd[2].pMethods = (sqlite3_io_methods *)0x0;
    pJfd[3].pMethods = (sqlite3_io_methods *)0x0;
    pJfd[4].pMethods = (sqlite3_io_methods *)0x0;
    pJfd[5].pMethods = (sqlite3_io_methods *)0x0;
    pJfd[6].pMethods = (sqlite3_io_methods *)0x0;
    pJfd[7].pMethods = (sqlite3_io_methods *)0x0;
    pJfd[8].pMethods = (sqlite3_io_methods *)0x0;
    pJfd[9].pMethods = (sqlite3_io_methods *)0x0;
    iVar16 = 0;
    iVar15 = (*psVar9->xSync)((sqlite3_file *)psVar9,(int)psVar10);
    if (iVar15 == 0) {
      if (psVar6 != (sqlite3_io_methods *)0x0) {
        lVar20 = 0;
        psVar19 = psVar6;
        iVar15 = iVar1;
        do {
          if ((long)psVar7 < iVar15 + lVar20) {
            iVar15 = (int)psVar7 - (int)lVar20;
          }
          iVar16 = (*pJfd->pMethods->xWrite)(pJfd,&psVar19->xClose,iVar15,lVar20);
          if (iVar16 != 0) goto LAB_0012bf90;
          lVar20 = lVar20 + iVar15;
          psVar19 = *(sqlite3_io_methods **)psVar19;
        } while (psVar19 != (sqlite3_io_methods *)0x0);
        iVar16 = 0;
      }
LAB_0012bf90:
      iVar15 = iVar16;
      if ((psVar6 != (sqlite3_io_methods *)0x0) && (psVar19 = psVar6, iVar16 == 0)) {
        do {
          psVar11 = *(sqlite3_io_methods **)psVar19;
          sqlite3_free(psVar19);
          psVar19 = psVar11;
        } while (psVar11 != (sqlite3_io_methods *)0x0);
      }
    }
    if (iVar15 != 0) {
      if (pJfd->pMethods != (sqlite3_io_methods *)0x0) {
        (*pJfd->pMethods->xClose)(pJfd);
        pJfd->pMethods = (sqlite3_io_methods *)0x0;
      }
      pJfd->pMethods = psVar5;
      *(int *)&pJfd[1].pMethods = iVar1;
      *(int *)((long)&pJfd[1].pMethods + 4) = iVar17;
      pJfd[2].pMethods = psVar6;
      pJfd[3].pMethods = psVar7;
      pJfd[6].pMethods = psVar8;
      pJfd[4].pMethods = psVar12;
      pJfd[5].pMethods = psVar13;
      *(undefined4 *)&pJfd[7].pMethods = uVar2;
      *(undefined4 *)((long)&pJfd[7].pMethods + 4) = uVar3;
      pJfd[8].pMethods = psVar9;
      pJfd[9].pMethods = psVar10;
      if (iVar15 != 0) goto LAB_0012c043;
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar4) {
      iVar17 = (*pJfd->pMethods->xWrite)(pJfd,zBuf,iAmt,iOfst);
      return iVar17;
    }
  }
  __stack_chk_fail();
}

Assistant:

static int memjrnlWrite(
  sqlite3_file *pJfd,    /* The journal file into which to write */
  const void *zBuf,      /* Take data to be written from here */
  int iAmt,              /* Number of bytes to write */
  sqlite_int64 iOfst     /* Begin writing at this offset into the file */
){
  MemJournal *p = (MemJournal *)pJfd;
  int nWrite = iAmt;
  u8 *zWrite = (u8 *)zBuf;

  /* If the file should be created now, create it and write the new data
  ** into the file on disk. */
  if( p->nSpill>0 && (iAmt+iOfst)>p->nSpill ){
    int rc = memjrnlCreateFile(p);
    if( rc==SQLITE_OK ){
      rc = sqlite3OsWrite(pJfd, zBuf, iAmt, iOfst);
    }
    return rc;
  }

  /* If the contents of this write should be stored in memory */
  else{
    /* An in-memory journal file should only ever be appended to. Random
    ** access writes are not required. The only exception to this is when
    ** the in-memory journal is being used by a connection using the
    ** atomic-write optimization. In this case the first 28 bytes of the
    ** journal file may be written as part of committing the transaction. */
    assert( iOfst<=p->endpoint.iOffset );
    if( iOfst>0 && iOfst!=p->endpoint.iOffset ){
      memjrnlTruncate(pJfd, iOfst);
    }
    if( iOfst==0 && p->pFirst ){
      assert( p->nChunkSize>iAmt );
      memcpy((u8*)p->pFirst->zChunk, zBuf, iAmt);
    }else{
      while( nWrite>0 ){
        FileChunk *pChunk = p->endpoint.pChunk;
        int iChunkOffset = (int)(p->endpoint.iOffset%p->nChunkSize);
        int iSpace = MIN(nWrite, p->nChunkSize - iChunkOffset);

        assert( pChunk!=0 || iChunkOffset==0 );
        if( iChunkOffset==0 ){
          /* New chunk is required to extend the file. */
          FileChunk *pNew = sqlite3_malloc(fileChunkSize(p->nChunkSize));
          if( !pNew ){
            return SQLITE_IOERR_NOMEM_BKPT;
          }
          pNew->pNext = 0;
          if( pChunk ){
            assert( p->pFirst );
            pChunk->pNext = pNew;
          }else{
            assert( !p->pFirst );
            p->pFirst = pNew;
          }
          pChunk = p->endpoint.pChunk = pNew;
        }

        assert( pChunk!=0 );
        memcpy((u8*)pChunk->zChunk + iChunkOffset, zWrite, iSpace);
        zWrite += iSpace;
        nWrite -= iSpace;
        p->endpoint.iOffset += iSpace;
      }
    }
  }

  return SQLITE_OK;
}